

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

bool __thiscall
phmap::priv::anon_unknown_0::SubstringLess::operator()(SubstringLess *this,string *a,string *b)

{
  uint uVar1;
  void *in_RCX;
  string *psVar3;
  string *__n;
  difference_type __diff;
  string *in_R8;
  ulong uVar2;
  
  psVar3 = (string *)(long)(int)this;
  if (psVar3 <= b) {
    b = psVar3;
  }
  if (in_R8 < psVar3) {
    psVar3 = in_R8;
  }
  __n = psVar3;
  if (b < psVar3) {
    __n = b;
  }
  if (__n != (string *)0x0) {
    uVar1 = memcmp(a,in_RCX,(size_t)__n);
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_001a7119;
  }
  uVar2 = 0xffffffff80000000;
  if (-0x80000000 < (long)b - (long)psVar3) {
    uVar2 = (long)b - (long)psVar3;
  }
  if (0x7ffffffe < (long)uVar2) {
    uVar2 = 0;
  }
LAB_001a7119:
  return (bool)((byte)(uVar2 >> 0x1f) & 1);
}

Assistant:

bool operator()(const std::string &a, const std::string &b) const {
#if PHMAP_HAVE_STD_STRING_VIEW
            return std::string_view(a).substr(0, n) <
                std::string_view(b).substr(0, n);
#else
            return a.substr(0, n) < b.substr(0, n);
#endif
        }